

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_ListOfEnums_Test::~ClCommandLine_ListOfEnums_Test
          (ClCommandLine_ListOfEnums_Test *this)

{
  ClCommandLine_ListOfEnums_Test *this_local;
  
  ~ClCommandLine_ListOfEnums_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, ListOfEnums) {
    list<enumeration> opt{
        "opt", values (literal{"a", static_cast<int> (enumeration::a), "a description"},
                       literal{"b", static_cast<int> (enumeration::b), "b description"},
                       literal{"c", static_cast<int> (enumeration::c), "c description"})};
    this->add ("progname", "--opt", "a", "--opt", "b");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_THAT (opt, ::testing::ElementsAre (enumeration::a, enumeration::b));
}